

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O2

void anon_unknown.dwarf_1c45058::WriteFilesArgument
               (ostream *os,string_view *keyword,
               vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
               *items,string *config,cmScriptGeneratorIndent indent)

{
  pointer puVar1;
  Item *pIVar2;
  ostream *poVar3;
  pointer puVar4;
  bool bVar5;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  char local_ce [2];
  cmScriptGeneratorIndent local_cc;
  ostream *local_c8;
  string_view *local_c0;
  string local_b8 [32];
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_cc.Level = indent.Level;
  local_c8 = os;
  local_c0 = keyword;
  std::__cxx11::string::string(local_b8,(string *)config);
  puVar1 = (items->
           super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = true;
  for (puVar4 = (items->
                super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    local_ce[1] = 0x22;
    pIVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
             .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl;
    (*pIVar2->_vptr_Item[2])(&local_70,pIVar2,local_b8);
    local_ce[0] = '\"';
    cmStrCat<char,std::__cxx11::string,char>(&local_50,local_ce + 1,&local_70,local_ce);
    std::__cxx11::string::~string((string *)&local_70);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_98,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (local_98._M_engaged == true) {
      if (bVar5) {
        poVar3 = ::operator<<(local_c8,local_cc);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_c0->_M_str,local_c0->_M_len);
        std::operator<<(poVar3,"\n");
      }
      poVar3 = ::operator<<(local_c8,local_cc);
      poVar3 = std::operator<<(poVar3,"    ");
      poVar3 = std::operator<<(poVar3,(string *)&local_98);
      std::operator<<(poVar3,"\n");
      bVar5 = false;
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_98);
  }
  std::__cxx11::string::~string(local_b8);
  return;
}

Assistant:

void WriteFilesArgument(
  std::ostream& os, const cm::string_view& keyword,
  const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
    items,
  const std::string& config, cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, items, indent,
    [config](const std::unique_ptr<cmInstallRuntimeDependencySet::Item>& i)
      -> std::string { return cmStrCat('"', i->GetItemPath(config), '"'); });
}